

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int sign_certificate(ptls_sign_certificate_t *_self,ptls_t *tls,uint16_t *selected_algorithm,
                    ptls_buffer_t *outbuf,ptls_iovec_t input,uint16_t *algorithms,
                    size_t num_algorithms)

{
  ptls_iovec_t input_00;
  int iVar1;
  ptls_buffer_t *in_RDX;
  st_ptls_openssl_signature_scheme_t *in_RSI;
  EVP_PKEY *in_RDI;
  uint8_t *in_R8;
  size_t in_R9;
  size_t i;
  st_ptls_openssl_signature_scheme_t *scheme;
  ptls_openssl_sign_certificate_t *self;
  st_ptls_openssl_signature_scheme_t *local_50;
  short *local_48;
  
  local_48 = *(short **)(in_RDI + 0x10);
  do {
    if (*local_48 == -1) {
      return 0x28;
    }
    for (local_50 = (st_ptls_openssl_signature_scheme_t *)0x0; local_50 != scheme;
        local_50 = (st_ptls_openssl_signature_scheme_t *)((long)&local_50->scheme_id + 1)) {
      if (*(short *)(i + (long)local_50 * 2) == *local_48) {
        *(short *)&in_RDX->base = *local_48;
        input_00.len = in_R9;
        input_00.base = in_R8;
        iVar1 = do_sign(in_RDI,in_RSI,in_RDX,input_00);
        return iVar1;
      }
    }
    local_48 = local_48 + 8;
  } while( true );
}

Assistant:

static int sign_certificate(ptls_sign_certificate_t *_self, ptls_t *tls, uint16_t *selected_algorithm, ptls_buffer_t *outbuf,
                            ptls_iovec_t input, const uint16_t *algorithms, size_t num_algorithms)
{
    ptls_openssl_sign_certificate_t *self = (ptls_openssl_sign_certificate_t *)_self;
    const struct st_ptls_openssl_signature_scheme_t *scheme;

    /* select the algorithm (driven by server-side preference of `self->schemes`) */
    for (scheme = self->schemes; scheme->scheme_id != UINT16_MAX; ++scheme) {
        size_t i;
        for (i = 0; i != num_algorithms; ++i)
            if (algorithms[i] == scheme->scheme_id)
                goto Found;
    }
    return PTLS_ALERT_HANDSHAKE_FAILURE;

Found:
    *selected_algorithm = scheme->scheme_id;
    return do_sign(self->key, scheme, outbuf, input);
}